

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O0

void init_mbmi_nonrd(MB_MODE_INFO *mbmi,PREDICTION_MODE pred_mode,MV_REFERENCE_FRAME ref_frame0,
                    MV_REFERENCE_FRAME ref_frame1,AV1_COMMON *cm)

{
  undefined1 in_CL;
  undefined1 in_DL;
  undefined1 in_SIL;
  long in_RDI;
  PALETTE_MODE_INFO *pmi;
  InterpFilter in_stack_ffffffffffffffdf;
  
  *(ushort *)(in_RDI + 0xa7) = *(ushort *)(in_RDI + 0xa7) & 0xffcf;
  *(undefined1 *)(in_RDI + 2) = in_SIL;
  *(undefined1 *)(in_RDI + 3) = 0;
  *(undefined1 *)(in_RDI + 0x10) = in_DL;
  *(undefined1 *)(in_RDI + 0x11) = in_CL;
  *(undefined1 *)(in_RDI + 0x8e) = 0;
  *(undefined1 *)(in_RDI + 0x8f) = 0;
  *(undefined1 *)(in_RDI + 0x5b) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined1 *)(in_RDI + 0x18) = 0;
  *(undefined1 *)(in_RDI + 0x19) = 1;
  *(undefined1 *)(in_RDI + 0x40) = 0;
  set_default_interp_filters((MB_MODE_INFO *)(in_RDI + 0x5e),in_stack_ffffffffffffffdf);
  return;
}

Assistant:

static inline void init_mbmi_nonrd(MB_MODE_INFO *mbmi,
                                   PREDICTION_MODE pred_mode,
                                   MV_REFERENCE_FRAME ref_frame0,
                                   MV_REFERENCE_FRAME ref_frame1,
                                   const AV1_COMMON *cm) {
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  mbmi->ref_mv_idx = 0;
  mbmi->mode = pred_mode;
  mbmi->uv_mode = UV_DC_PRED;
  mbmi->ref_frame[0] = ref_frame0;
  mbmi->ref_frame[1] = ref_frame1;
  pmi->palette_size[PLANE_TYPE_Y] = 0;
  pmi->palette_size[PLANE_TYPE_UV] = 0;
  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  mbmi->mv[0].as_int = mbmi->mv[1].as_int = 0;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->num_proj_ref = 1;
  mbmi->interintra_mode = 0;
  set_default_interp_filters(mbmi, cm->features.interp_filter);
}